

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O3

int Io_WriteMoPlaOneIntMintermsM(FILE *pFile,Abc_Ntk_t *pNtk,DdManager *dd,DdNode *bFunc,int nMints)

{
  int n;
  int *array;
  DdNode **__ptr;
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  
  n = dd->size;
  array = (int *)calloc((long)n,4);
  __ptr = Cudd_bddPickArbitraryMinterms(dd,bFunc,dd->vars,n,nMints);
  if (dd->size != pNtk->vCis->nSize) {
    __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0x1d3,
                  "int Io_WriteMoPlaOneIntMintermsM(FILE *, Abc_Ntk_t *, DdManager *, DdNode *, int)"
                 );
  }
  fprintf((FILE *)pFile,".i %d\n");
  fprintf((FILE *)pFile,".o %d\n",1);
  fwrite(".ilb",4,1,(FILE *)pFile);
  pVVar1 = pNtk->vCis;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[lVar4]);
      fprintf((FILE *)pFile," %s",pcVar2);
      lVar4 = lVar4 + 1;
      pVVar1 = pNtk->vCis;
    } while (lVar4 < pVVar1->nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  if (0 < pNtk->vCos->nSize) {
    pcVar2 = Abc_ObjName((Abc_Obj_t *)*pNtk->vCos->pArray);
    fprintf((FILE *)pFile," %s",pcVar2);
    fputc(10,(FILE *)pFile);
    fprintf((FILE *)pFile,".p %d\n",nMints);
    if (0 < nMints) {
      uVar3 = 0;
      do {
        Cudd_BddToCubeArray(dd,__ptr[uVar3],array);
        if (0 < pNtk->vCis->nSize) {
          lVar4 = 0;
          do {
            if ((ulong)(uint)array[lVar4] < 3) {
              fputc(*(int *)(&DAT_009ae02c + (ulong)(uint)array[lVar4] * 4),(FILE *)pFile);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < pNtk->vCis->nSize);
        }
        fputc(0x20,(FILE *)pFile);
        fputc(0x31,(FILE *)pFile);
        fputc(10,(FILE *)pFile);
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nMints);
    }
    fwrite(".e\n",3,1,(FILE *)pFile);
    if (__ptr != (DdNode **)0x0) {
      free(__ptr);
    }
    if (array != (int *)0x0) {
      free(array);
    }
    return 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Io_WriteMoPlaOneIntMintermsM( FILE * pFile, Abc_Ntk_t * pNtk, DdManager * dd, DdNode * bFunc, int nMints )
{
    Abc_Obj_t * pNode;
    int * pArray = ABC_CALLOC( int, dd->size );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( dd, bFunc, dd->vars, dd->size, nMints );
    int i, k, nInputs = Abc_NtkCiNum(pNtk);
    assert( dd->size == Abc_NtkCiNum(pNtk) );

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, 0)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nMints );

    // iterate through minterms
    for ( k = 0; k < nMints; k++ )
    {
        Cudd_BddToCubeArray( dd, pbMints[k], pArray );
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pArray[i] == 0 )
                fprintf( pFile, "%c", '0' );
            else if ( pArray[i] == 1 )
                fprintf( pFile, "%c", '1' );
            else if ( pArray[i] == 2 )
                fprintf( pFile, "%c", '-' );
        fprintf( pFile, " " );
        fprintf( pFile, "%c", '1' );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e\n" );

    //for ( k = 0; k < nMints; k++ )
    //    Cudd_RecursiveDeref( dd, pbMints[k] );
    ABC_FREE( pbMints );
    ABC_FREE( pArray );
    return 1;
}